

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::fixXfbOffsets(TParseContext *this,TQualifier *qualifier,TTypeList *typeList)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  pointer pTVar4;
  undefined4 extraout_var;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  bool contains16BitType;
  bool contains32BitType;
  bool contains64BitType;
  bool local_43;
  bool local_42;
  bool local_41;
  TQualifier *local_40;
  TParseContext *local_38;
  
  uVar6 = *(ulong *)&qualifier->field_0x24;
  uVar1 = ~(uint)uVar6;
  if ((uVar1 & 0x7ffc0000) != 0 && (uVar1 & 0xf) != 0) {
    pTVar4 = (typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
             ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar4) {
      uVar1 = (uint)uVar6 >> 0x12;
      uVar7 = 1;
      uVar6 = 0;
      local_40 = qualifier;
      local_38 = this;
      do {
        iVar2 = (*(pTVar4[uVar6].type)->_vptr_TType[10])();
        local_41 = false;
        local_42 = false;
        local_43 = false;
        uVar3 = TIntermediate::computeTypeXfbSize
                          ((local_38->super_TParseContextBase).super_TParseVersions.intermediate,
                           (typeList->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ).
                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar6].type,&local_41,&local_42
                           ,&local_43);
        uVar6 = *(ulong *)(CONCAT44(extraout_var,iVar2) + 0x24);
        uVar5 = (uint)uVar6;
        if ((~uVar5 & 0x7ffc0000) == 0) {
          if (local_41 == true) {
            uVar1 = uVar1 + 7 & 0xfffffff8;
          }
          else if (local_42 == true) {
            uVar1 = uVar1 + 3 & 0xfffffffc;
          }
          else if (local_43 == true) {
            uVar1 = uVar1 + 1 & 0xfffffffe;
          }
          *(ulong *)(CONCAT44(extraout_var,iVar2) + 0x24) =
               uVar6 & 0xffffffff8003ffff | (ulong)((uVar1 & 0x1fff) << 0x12);
        }
        else {
          uVar1 = uVar5 >> 0x12;
        }
        uVar1 = uVar1 + uVar3;
        uVar6 = (ulong)uVar7;
        pTVar4 = (typeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar7 = uVar7 + 1;
      } while (uVar6 < (ulong)((long)(typeList->
                                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                     ).
                                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4 >> 5)
              );
      uVar6 = *(ulong *)&local_40->field_0x24;
      qualifier = local_40;
    }
    *(ulong *)&qualifier->field_0x24 = uVar6 | 0x7ffc0000;
  }
  return;
}

Assistant:

void TParseContext::fixXfbOffsets(TQualifier& qualifier, TTypeList& typeList)
{
    // "If a block is qualified with xfb_offset, all its
    // members are assigned transform feedback buffer offsets. If a block is not qualified with xfb_offset, any
    // members of that block not qualified with an xfb_offset will not be assigned transform feedback buffer
    // offsets."

    if (! qualifier.hasXfbBuffer() || ! qualifier.hasXfbOffset())
        return;

    int nextOffset = qualifier.layoutXfbOffset;
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        bool contains64BitType = false;
        bool contains32BitType = false;
        bool contains16BitType = false;
        int memberSize = intermediate.computeTypeXfbSize(*typeList[member].type, contains64BitType, contains32BitType, contains16BitType);
        // see if we need to auto-assign an offset to this member
        if (! memberQualifier.hasXfbOffset()) {
            // "if applied to an aggregate containing a double or 64-bit integer, the offset must also be a multiple of 8"
            if (contains64BitType)
                RoundToPow2(nextOffset, 8);
            else if (contains32BitType)
                RoundToPow2(nextOffset, 4);
            else if (contains16BitType)
                RoundToPow2(nextOffset, 2);
            memberQualifier.layoutXfbOffset = nextOffset;
        } else
            nextOffset = memberQualifier.layoutXfbOffset;
        nextOffset += memberSize;
    }

    // The above gave all block members an offset, so we can take it off the block now,
    // which will avoid double counting the offset usage.
    qualifier.layoutXfbOffset = TQualifier::layoutXfbOffsetEnd;
}